

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void send_msg(int sock)

{
  long lVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  string name_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_70;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '@');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&msg_abi_cxx11_,cVar2);
  iVar3 = std::__cxx11::string::compare((char *)&msg_abi_cxx11_);
  if (iVar3 != 0) {
    do {
      iVar3 = std::__cxx11::string::compare((char *)&msg_abi_cxx11_);
      if (iVar3 == 0) break;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,name_abi_cxx11_._M_dataplus._M_p,
                 name_abi_cxx11_._M_dataplus._M_p + name_abi_cxx11_._M_string_length);
      std::__cxx11::string::append((char *)local_50);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)msg_abi_cxx11_._M_dataplus._M_p);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar5;
        local_70 = (long *)*plVar4;
      }
      lVar1 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      send(sock,local_70,lVar1 + 1,0);
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '@');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&msg_abi_cxx11_,cVar2);
      iVar3 = std::__cxx11::string::compare((char *)&msg_abi_cxx11_);
    } while (iVar3 != 0);
  }
  close(sock);
  exit(0);
}

Assistant:

void send_msg(int sock){
    while(1){
        getline(std::cin, msg);
        if (msg == "Quit"|| msg == "quit"){
            close(sock);
            exit(0);
        }
        // 生成消息格式（[name] massage）
        std::string name_msg = name + " " + msg;
        send(sock, name_msg.c_str(), name_msg.length() + 1, 0);
    }
}